

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result wabt::ValidateModule(Module *module,Errors *errors,ValidateOptions *options)

{
  Result RVar1;
  undefined1 local_2a0 [8];
  Validator validator;
  ValidateOptions *options_local;
  Errors *errors_local;
  Module *module_local;
  
  validator._624_8_ = options;
  anon_unknown_4::Validator::Validator((Validator *)local_2a0,errors,module,options);
  RVar1 = anon_unknown_4::Validator::CheckModule((Validator *)local_2a0);
  anon_unknown_4::Validator::~Validator((Validator *)local_2a0);
  return (Result)RVar1.enum_;
}

Assistant:

Result ValidateModule(const Module* module,
                      Errors* errors,
                      const ValidateOptions& options) {
  Validator validator(errors, module, options);

  return validator.CheckModule();
}